

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_check_length_range(ly_ctx *ctx,char *expr,lys_type *type)

{
  char cVar1;
  uint8_t uVar2;
  ushort uVar3;
  ushort *puVar4;
  char *pcVar5;
  int iVar6;
  ushort **ppuVar7;
  len_ran_intv *__s1;
  uint uVar8;
  char *pcVar9;
  len_ran_intv *plVar10;
  len_ran_intv *local_58;
  len_ran_intv *intv;
  char *tail;
  ushort **local_40;
  int local_34;
  
  local_58 = (len_ran_intv *)0x0;
  tail = (char *)type;
  if (expr == (char *)0x0) {
    __assert_fail("expr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x2c4,
                  "int lyp_check_length_range(struct ly_ctx *, const char *, struct lys_type *)");
  }
  local_34 = 1;
  local_40 = __ctype_b_loc();
  ppuVar7 = local_40;
  plVar10 = (len_ran_intv *)expr;
LAB_001241b1:
  puVar4 = *ppuVar7;
  pcVar9 = (char *)((long)plVar10 + -1);
  pcVar5 = (char *)((long)plVar10 + 2);
  do {
    __s1 = (len_ran_intv *)pcVar5;
    cVar1 = pcVar9[1];
    pcVar9 = pcVar9 + 1;
    uVar3 = puVar4[cVar1];
    pcVar5 = (char *)((long)__s1 + 1);
  } while ((uVar3 >> 0xd & 1) != 0);
  iVar6 = strncmp(pcVar9,"max",3);
  ppuVar7 = local_40;
  if (iVar6 == 0) goto LAB_00124393;
  iVar6 = strncmp(pcVar9,"min",3);
  ppuVar7 = local_40;
  if (iVar6 == 0) {
    uVar8 = 1;
    if (local_34 == 0) goto joined_r0x001243d8;
    do {
      cVar1 = *(char *)((long)__s1 + 1);
      __s1 = (len_ran_intv *)((long)__s1 + 1);
    } while ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    if (cVar1 == '|') {
      local_34 = 0;
      goto LAB_0012437c;
    }
    if (cVar1 != '\0') {
      iVar6 = strncmp((char *)__s1,"..",2);
      local_34 = 0;
      if (iVar6 == 0) goto LAB_001242f0;
      goto joined_r0x001243d8;
    }
    goto LAB_001243b3;
  }
  if (((((uVar3 >> 0xb & 1) != 0) || (cVar1 == '-')) || (cVar1 == '+')) &&
     (check_number(pcVar9,(char **)&intv,*(LY_DATA_TYPE *)tail), ppuVar7 = local_40,
     (len_ran_intv *)pcVar9 != intv)) goto code_r0x00124248;
  uVar8 = 1;
  goto joined_r0x001243d8;
code_r0x00124248:
  plVar10 = intv;
  do {
    __s1 = plVar10;
    uVar2 = __s1->kind;
    plVar10 = (len_ran_intv *)&__s1->field_0x1;
  } while ((*(byte *)((long)*local_40 + (long)(char)uVar2 * 2 + 1) & 0x20) != 0);
  if (uVar2 != '|') {
    if ((uVar2 == '\0') || (iVar6 = strncmp((char *)__s1,"..",2), iVar6 != 0)) goto LAB_001243b3;
LAB_001242f0:
    pcVar9 = &__s1->field_0x1;
    do {
      pcVar5 = pcVar9 + 1;
      pcVar9 = pcVar9 + 1;
    } while ((*(byte *)((long)*ppuVar7 + (long)*pcVar5 * 2 + 1) & 0x20) != 0);
    uVar8 = 1;
    if (*pcVar5 == '\0') goto joined_r0x001243d8;
    iVar6 = strncmp(pcVar9,"max",3);
    if (iVar6 == 0) {
LAB_00124393:
      pcVar9 = pcVar9 + 3;
      do {
        cVar1 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while ((*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    }
    else {
      check_number(pcVar9,(char **)&intv,*(LY_DATA_TYPE *)tail);
      if ((len_ran_intv *)pcVar9 == intv) goto joined_r0x001243d8;
      __s1 = (len_ran_intv *)((long)&intv[-1].next + 7);
      do {
        cVar1 = *(char *)((long)__s1 + 1);
        __s1 = (len_ran_intv *)((long)__s1 + 1);
      } while ((*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      if (cVar1 == '|') {
LAB_0012437c:
        plVar10 = (len_ran_intv *)((long)__s1 + 1);
        goto LAB_001241b1;
      }
    }
    uVar8 = 1;
    if (cVar1 == '\0') {
LAB_001243b3:
      iVar6 = resolve_len_ran_interval(ctx,expr,(lys_type *)tail,&local_58);
      uVar8 = (uint)(iVar6 != 0);
    }
joined_r0x001243d8:
    while (local_58 != (len_ran_intv *)0x0) {
      plVar10 = local_58->next;
      free(local_58);
      local_58 = plVar10;
    }
    return uVar8;
  }
  goto LAB_001241b1;
}

Assistant:

int
lyp_check_length_range(struct ly_ctx *ctx, const char *expr, struct lys_type *type)
{
    struct len_ran_intv *intv = NULL, *tmp_intv;
    const char *c = expr, *tail;
    int ret = EXIT_FAILURE, flg = 1; /* first run flag */

    assert(expr);

lengthpart:

    while (isspace(*c)) {
        c++;
    }

    /* lower boundary or explicit number */
    if (!strncmp(c, "max", 3)) {
max:
        c += 3;
        while (isspace(*c)) {
            c++;
        }
        if (*c != '\0') {
            goto error;
        }

        goto syntax_ok;

    } else if (!strncmp(c, "min", 3)) {
        if (!flg) {
            /* min cannot be used elsewhere than in the first length-part */
            goto error;
        } else {
            flg = 0;
        }
        c += 3;
        while (isspace(*c)) {
            c++;
        }

        if (*c == '|') {
            c++;
            /* process next length-part */
            goto lengthpart;
        } else if (*c == '\0') {
            goto syntax_ok;
        } else if (!strncmp(c, "..", 2)) {
upper:
            c += 2;
            while (isspace(*c)) {
                c++;
            }
            if (*c == '\0') {
                goto error;
            }

            /* upper boundary */
            if (!strncmp(c, "max", 3)) {
                goto max;
            }

            check_number(c, &tail, type->base);
            if (c == tail) {
                goto error;
            }
            c = tail;
            while (isspace(*c)) {
                c++;
            }
            if (*c == '\0') {
                goto syntax_ok;
            } else if (*c == '|') {
                c++;
                /* process next length-part */
                goto lengthpart;
            } else {
                goto error;
            }
        } else {
            goto error;
        }

    } else if (isdigit(*c) || (*c == '-') || (*c == '+')) {
        /* number */
        check_number(c, &tail, type->base);
        if (c == tail) {
            goto error;
        }
        c = tail;

        while (isspace(*c)) {
            c++;
        }

        if (*c == '|') {
            c++;
            /* process next length-part */
            goto lengthpart;
        } else if (*c == '\0') {
            goto syntax_ok;
        } else if (!strncmp(c, "..", 2)) {
            goto upper;
        }

    } else {
        goto error;
    }

syntax_ok:
    if (resolve_len_ran_interval(ctx, expr, type, &intv)) {
        goto error;
    }

    ret = EXIT_SUCCESS;

error:
    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }

    return ret;
}